

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItem::mouseMoveEvent(QGraphicsItem *this,QGraphicsSceneMouseEvent *event)

{
  uchar *puVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsScene *this_00;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  qreal qVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  MouseButtons MVar10;
  QWidget *pQVar11;
  QPoint QVar12;
  long lVar13;
  Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *pDVar14;
  QPointF *point;
  qreal *pqVar15;
  QTransform *pQVar16;
  QGraphicsItem *pQVar17;
  QTransform *pQVar18;
  int iVar19;
  qreal qVar20;
  long in_FS_OFFSET;
  byte bVar21;
  double dVar22;
  double in_XMM1_Qa;
  qreal qVar23;
  double dVar24;
  QPointF QVar25;
  QGraphicsItem *item;
  QTransform itemTransform;
  qreal local_278;
  qreal local_268;
  QWidget *local_258;
  qreal local_248;
  QGraphicsItem *local_228;
  QHash<QGraphicsItem_*,_QPointF> local_220;
  QTransform local_218;
  QTransform local_1c8;
  QPoint local_178 [10];
  QTransform local_128;
  QTransform local_d8;
  QTransform local_88;
  long local_38;
  
  bVar21 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MVar10 = QGraphicsSceneMouseEvent::buttons(event);
  if ((((uint)MVar10.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
              super_QFlagsStorage<Qt::MouseButton>.i & 1) == 0) ||
     (pQVar2 = (this->d_ptr).d, (pQVar2->field_0x164 & 1) == 0)) {
    (event->super_QGraphicsSceneEvent).field_0xc = 0;
  }
  else {
    local_220.d = (Data *)0x0;
    this_00 = (QGraphicsScene *)pQVar2->scene;
    if (this_00 == (QGraphicsScene *)0x0) {
      qVar20 = 0.0;
      local_278 = 0.0;
      pDVar14 = (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)0x0;
    }
    else {
      QGraphicsScene::selectedItems((QList<QGraphicsItem_*> *)&local_88,this_00);
      qVar20 = local_88.m_matrix[0][2];
      pDVar14 = (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)local_88.m_matrix[0][0];
      qVar23 = local_88.m_matrix[0][1];
      local_278 = local_88.m_matrix[0][1];
      local_88.m_matrix[0]._0_16_ = ZEXT816(0);
      local_88.m_matrix[0][2] = 0.0;
      QHash<QGraphicsItem_*,_QPointF>::operator=
                (&local_220,
                 (QHash<QGraphicsItem_*,_QPointF> *)
                 (*(long *)&((this->d_ptr).d)->scene->field_0x8 + 0x160));
      if ((local_220.d == (Data *)0x0) || ((local_220.d)->size == 0)) {
        if (qVar20 != 0.0) {
          lVar13 = 0;
          do {
            local_d8.m_matrix[0][0] = *(qreal *)((long)qVar23 + lVar13);
            uVar4 = *(undefined8 *)(*(long *)((long)local_d8.m_matrix[0][0] + 8) + 0x68);
            uVar5 = *(undefined8 *)(*(long *)((long)local_d8.m_matrix[0][0] + 8) + 0x70);
            QHash<QGraphicsItem*,QPointF>::tryEmplace_impl<QGraphicsItem*const&>
                      ((TryEmplaceResult *)&local_88,&local_220,(QGraphicsItem **)&local_d8);
            puVar1 = (*(Span **)((long)local_88.m_matrix[0][0] + 0x20))
                     [(ulong)local_88.m_matrix[0][1] >> 7].entries
                     [(*(Span **)((long)local_88.m_matrix[0][0] + 0x20))
                      [(ulong)local_88.m_matrix[0][1] >> 7].offsets
                      [local_88.m_matrix[0][1]._0_4_ & 0x7f]].storage.data + 8;
            *(undefined8 *)puVar1 = uVar4;
            *(undefined8 *)(puVar1 + 8) = uVar5;
            lVar13 = lVar13 + 8;
          } while ((long)qVar20 * 8 - lVar13 != 0);
        }
        pQVar2 = (this->d_ptr).d;
        qVar23 = (pQVar2->pos).xp;
        qVar6 = (pQVar2->pos).yp;
        local_d8.m_matrix[0][0] = (qreal)this;
        QHash<QGraphicsItem*,QPointF>::tryEmplace_impl<QGraphicsItem*const&>
                  ((TryEmplaceResult *)&local_88,&local_220,(QGraphicsItem **)&local_d8);
        puVar1 = (*(Span **)((long)local_88.m_matrix[0][0] + 0x20))
                 [(ulong)local_88.m_matrix[0][1] >> 7].entries
                 [(*(Span **)((long)local_88.m_matrix[0][0] + 0x20))
                  [(ulong)local_88.m_matrix[0][1] >> 7].offsets
                  [local_88.m_matrix[0][1]._0_4_ & 0x7f]].storage.data + 8;
        *(qreal *)puVar1 = qVar23;
        *(qreal *)(puVar1 + 8) = qVar6;
      }
      QHash<QGraphicsItem_*,_QPointF>::operator=
                ((QHash<QGraphicsItem_*,_QPointF> *)
                 (*(long *)&((this->d_ptr).d)->scene->field_0x8 + 0x160),&local_220);
    }
    pQVar11 = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
    iVar19 = 0;
    if (pQVar11 == (QWidget *)0x0) {
      local_258 = (QWidget *)0x0;
    }
    else {
      QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
      local_258 = (QWidget *)QMetaObject::cast((QObject *)&QGraphicsView::staticMetaObject);
    }
    bVar9 = false;
    do {
      lVar13 = (long)iVar19;
      if ((long)qVar20 < lVar13) break;
      local_228 = this;
      if (lVar13 < (long)qVar20) {
        local_228 = *(QGraphicsItem **)((long)local_278 + lVar13 * 8);
      }
      bVar7 = bVar9;
      if ((local_228 == this) && (bVar7 = true, bVar9)) {
        bVar8 = false;
      }
      else {
        if (((*(ulong *)&((local_228->d_ptr).d)->field_0x160 & 0x100000000) != 0) &&
           (bVar9 = QGraphicsItemPrivate::movableAncestorIsSelected(local_228), pQVar17 = local_228,
           !bVar9)) {
          if (local_258 == (QWidget *)0x0) {
LAB_005efe91:
            QVar25 = QGraphicsSceneMouseEvent::scenePos(event);
            local_d8.m_matrix[0][1] = QVar25.yp;
            local_d8.m_matrix[0][0] = QVar25.xp;
            QVar25 = mapFromScene(pQVar17,(QPointF *)&local_d8);
            local_88.m_matrix[0][1] = QVar25.yp;
            local_88.m_matrix[0][0] = QVar25.xp;
            QVar25 = mapToParent(pQVar17,(QPointF *)&local_88);
            pQVar17 = local_228;
            local_248 = QVar25.yp;
            local_268 = QVar25.xp;
            QVar25 = QGraphicsSceneMouseEvent::buttonDownScenePos(event,LeftButton);
            local_d8.m_matrix[0][1] = QVar25.yp;
            local_d8.m_matrix[0][0] = QVar25.xp;
            point = (QPointF *)&local_88;
            local_88.m_matrix[0]._0_16_ = mapFromScene(pQVar17,(QPointF *)&local_d8);
LAB_005f00a3:
            QVar25 = mapToParent(pQVar17,point);
            dVar24 = QVar25.yp;
            dVar22 = QVar25.xp;
          }
          else {
            uVar3 = *(ulong *)&((local_228->d_ptr).d)->field_0x160;
            if (((uint)uVar3 >> 0x12 & 1) != 0) {
              pqVar15 = (qreal *)&DAT_00700eb8;
              pQVar16 = &local_88;
              for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
                pQVar16->m_matrix[0][0] = *pqVar15;
                pqVar15 = pqVar15 + (ulong)bVar21 * -2 + 1;
                pQVar16 = (QTransform *)((long)pQVar16 + ((ulong)bVar21 * -2 + 1) * 8);
              }
              QGraphicsView::viewportTransform(&local_128,(QGraphicsView *)local_258);
              deviceTransform(&local_d8,pQVar17,&local_128);
              QTransform::inverted((bool *)&local_88);
              local_178[0] = QGraphicsSceneMouseEvent::screenPos(event);
              QVar12 = QWidget::mapFromGlobal(local_258,local_178);
              local_128.m_matrix[0][0] = (qreal)QVar12.xp.m_i.m_i;
              local_128.m_matrix[0][1] = (qreal)QVar12.yp.m_i.m_i;
              local_d8.m_matrix[0][0] = (qreal)QTransform::map((QPointF *)&local_88);
              local_d8.m_matrix[0][1] = in_XMM1_Qa;
              QVar25 = mapToParent(this,(QPointF *)&local_d8);
              local_248 = QVar25.yp;
              local_268 = QVar25.xp;
              qVar23 = local_248;
              local_178[0] = QGraphicsSceneMouseEvent::buttonDownScreenPos(event,LeftButton);
              QVar12 = QWidget::mapFromGlobal(local_258,local_178);
              local_128.m_matrix[0][0] = (qreal)QVar12.xp.m_i.m_i;
              local_128.m_matrix[0][1] = (qreal)QVar12.yp.m_i.m_i;
              local_d8.m_matrix[0][0] = (qreal)QTransform::map((QPointF *)&local_88);
              point = (QPointF *)&local_d8;
              pQVar17 = this;
              local_d8.m_matrix[0][1] = qVar23;
              goto LAB_005f00a3;
            }
            if ((uVar3 >> 0x25 & 1) == 0) goto LAB_005efe91;
            pqVar15 = (qreal *)&DAT_00700eb8;
            pQVar16 = &local_88;
            for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
              pQVar16->m_matrix[0][0] = *pqVar15;
              pqVar15 = pqVar15 + (ulong)bVar21 * -2 + 1;
              pQVar16 = (QTransform *)((long)pQVar16 + ((ulong)bVar21 * -2 + 1) * 8);
            }
            pqVar15 = (qreal *)&DAT_00700e28;
            pQVar16 = &local_88;
            for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
              pQVar16->m_matrix[0][0] = *pqVar15;
              pqVar15 = pqVar15 + (ulong)bVar21 * -2 + 1;
              pQVar16 = (QTransform *)((long)pQVar16 + ((ulong)bVar21 * -2 + 1) * 8);
            }
            local_88._72_2_ = local_88._72_2_ & 0xfc00;
            if (((local_228->d_ptr).d)->transformData != (TransformData *)0x0) {
              QGraphicsItemPrivate::TransformData::computedFullTransform
                        (&local_d8,((local_228->d_ptr).d)->transformData,(QTransform *)0x0);
              pQVar16 = &local_d8;
              pQVar18 = &local_88;
              for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
                pQVar18->m_matrix[0][0] = pQVar16->m_matrix[0][0];
                pQVar16 = (QTransform *)((long)pQVar16 + ((ulong)bVar21 * -2 + 1) * 8);
                pQVar18 = (QTransform *)((long)pQVar18 + ((ulong)bVar21 * -2 + 1) * 8);
              }
              local_88._72_2_ = local_d8._72_2_;
            }
            pQVar2 = (local_228->d_ptr).d;
            local_248 = (pQVar2->pos).yp;
            QTransform::translate((pQVar2->pos).xp,local_248);
            pQVar17 = local_228;
            pqVar15 = (qreal *)&DAT_00700eb8;
            pQVar16 = &local_d8;
            for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
              pQVar16->m_matrix[0][0] = *pqVar15;
              pqVar15 = pqVar15 + (ulong)bVar21 * -2 + 1;
              pQVar16 = (QTransform *)((long)pQVar16 + ((ulong)bVar21 * -2 + 1) * 8);
            }
            pQVar2 = (local_228->d_ptr).d;
            local_128.m_matrix[0][0] = (qreal)pQVar2->q_ptr;
            QGraphicsItemPrivate::ensureSceneTransformRecursive(pQVar2,(QGraphicsItem **)&local_128)
            ;
            pQVar16 = &((pQVar17->d_ptr).d)->sceneTransform;
            pQVar18 = &local_1c8;
            for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
              pQVar18->m_matrix[0][0] = pQVar16->m_matrix[0][0];
              pQVar16 = (QTransform *)((long)pQVar16 + (ulong)bVar21 * -0x10 + 8);
              pQVar18 = (QTransform *)((long)pQVar18 + ((ulong)bVar21 * -2 + 1) * 8);
            }
            QGraphicsView::viewportTransform(&local_218,(QGraphicsView *)local_258);
            QTransform::operator*((QTransform *)local_178,&local_1c8);
            QTransform::inverted((bool *)&local_128);
            QTransform::operator*(&local_d8,&local_88);
            local_178[0] = QGraphicsSceneMouseEvent::screenPos(event);
            QVar12 = QWidget::mapFromGlobal(local_258,local_178);
            local_128.m_matrix[0][0] = (qreal)QVar12.xp.m_i.m_i;
            local_128.m_matrix[0][1] = (qreal)QVar12.yp.m_i.m_i;
            local_268 = (qreal)QTransform::map((QPointF *)&local_d8);
            dVar24 = local_248;
            local_178[0] = QGraphicsSceneMouseEvent::buttonDownScreenPos(event,LeftButton);
            QVar12 = QWidget::mapFromGlobal(local_258,local_178);
            local_128.m_matrix[0][0] = (qreal)QVar12.xp.m_i.m_i;
            local_128.m_matrix[0][1] = (qreal)QVar12.yp.m_i.m_i;
            dVar22 = (double)QTransform::map((QPointF *)&local_d8);
          }
          pQVar17 = local_228;
          QVar25 = QHash<QGraphicsItem_*,_QPointF>::value(&local_220,&local_228);
          in_XMM1_Qa = QVar25.yp;
          dVar24 = (in_XMM1_Qa + local_248) - dVar24;
          local_88.m_matrix[0][1]._0_4_ = SUB84(dVar24,0);
          local_88.m_matrix[0][0] = (QVar25.xp + local_268) - dVar22;
          local_88.m_matrix[0][1]._4_4_ = (int)((ulong)dVar24 >> 0x20);
          setPos(pQVar17,(QPointF *)&local_88);
          if ((((local_228->d_ptr).d)->field_0x164 & 2) != 0) {
            setSelected(local_228,true);
          }
        }
        iVar19 = iVar19 + 1;
        bVar8 = true;
        bVar9 = bVar7;
      }
    } while (bVar8);
    QHash<QGraphicsItem_*,_QPointF>::~QHash(&local_220);
    if (pDVar14 != (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)0x0) {
      LOCK();
      (pDVar14->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar14->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar14->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)pDVar14,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::mouseMoveEvent(QGraphicsSceneMouseEvent *event)
{
    if ((event->buttons() & Qt::LeftButton) && (flags() & ItemIsMovable)) {
        // Determine the list of items that need to be moved.
        QList<QGraphicsItem *> selectedItems;
        QHash<QGraphicsItem *, QPointF> initialPositions;
        if (d_ptr->scene) {
            selectedItems = d_ptr->scene->selectedItems();
            initialPositions = d_ptr->scene->d_func()->movingItemsInitialPositions;
            if (initialPositions.isEmpty()) {
                for (QGraphicsItem *item : std::as_const(selectedItems))
                    initialPositions[item] = item->pos();
                initialPositions[this] = pos();
            }
            d_ptr->scene->d_func()->movingItemsInitialPositions = initialPositions;
        }

        // Find the active view.
        QGraphicsView *view = nullptr;
        if (event->widget())
            view = qobject_cast<QGraphicsView *>(event->widget()->parentWidget());

        // Move all selected items
        int i = 0;
        bool movedMe = false;
        while (i <= selectedItems.size()) {
            QGraphicsItem *item = nullptr;
            if (i < selectedItems.size())
                item = selectedItems.at(i);
            else
                item = this;
            if (item == this) {
                // Slightly clumsy-looking way to ensure that "this" is part
                // of the list of items to move, this is to avoid allocations
                // (appending this item to the list of selected items causes a
                // detach).
                if (movedMe)
                    break;
                movedMe = true;
            }

            if ((item->flags() & ItemIsMovable) && !QGraphicsItemPrivate::movableAncestorIsSelected(item)) {
                QPointF currentParentPos;
                QPointF buttonDownParentPos;
                if (view && (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorIgnoresTransformations)) {
                    // Items whose ancestors ignore transformations need to
                    // map screen coordinates to local coordinates, then map
                    // those to the parent.
                    QTransform viewToItemTransform = (item->deviceTransform(view->viewportTransform())).inverted();
                    currentParentPos = mapToParent(viewToItemTransform.map(QPointF(view->mapFromGlobal(event->screenPos()))));
                    buttonDownParentPos = mapToParent(viewToItemTransform.map(QPointF(view->mapFromGlobal(event->buttonDownScreenPos(Qt::LeftButton)))));
                } else if (view && (item->flags() & ItemIgnoresTransformations)) {
                    // Root items that ignore transformations need to
                    // calculate their diff by mapping viewport coordinates
                    // directly to parent coordinates.
                    // COMBINE
                    QTransform itemTransform;
                    if (item->d_ptr->transformData)
                        itemTransform = item->d_ptr->transformData->computedFullTransform();
                    itemTransform.translate(item->d_ptr->pos.x(), item->d_ptr->pos.y());
                    QTransform viewToParentTransform = itemTransform
                                                       * (item->sceneTransform() * view->viewportTransform()).inverted();
                    currentParentPos = viewToParentTransform.map(QPointF(view->mapFromGlobal(event->screenPos())));
                    buttonDownParentPos = viewToParentTransform.map(QPointF(view->mapFromGlobal(event->buttonDownScreenPos(Qt::LeftButton))));
                } else {
                    // All other items simply map from the scene.
                    currentParentPos = item->mapToParent(item->mapFromScene(event->scenePos()));
                    buttonDownParentPos = item->mapToParent(item->mapFromScene(event->buttonDownScenePos(Qt::LeftButton)));
                }

                item->setPos(initialPositions.value(item) + currentParentPos - buttonDownParentPos);

                if (item->flags() & ItemIsSelectable)
                    item->setSelected(true);
            }
            ++i;
        }

    } else {
        event->ignore();
    }
}